

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O1

int callback_lws_mirror(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  lws_context *plVar5;
  ulong uVar6;
  long lVar7;
  char *format;
  uint uVar8;
  uint rands [4];
  uchar buf [12304];
  uint local_3048;
  uint local_3044;
  byte local_3040;
  uint local_303c;
  byte abStack_3038 [16];
  byte local_3028 [12296];
  
  if ((int)reason < 10) {
    if (reason == LWS_CALLBACK_CLIENT_ESTABLISHED) {
      _lws_log(4,"mirror: LWS_CALLBACK_CLIENT_ESTABLISHED\n");
      if (flag_echo == '\x01') {
        txb = 0;
        rxb = 0;
        tx_0 = 0xabcde;
        rx_0 = 0xabcde;
        tx_1 = 0x23456789;
        rx_1 = 0x23456789;
      }
      else {
        plVar5 = lws_get_context(wsi);
        lws_get_random(plVar5,&local_3048,4);
        mirror_lifetime = (ushort)local_3048 + 0x4000;
        if (longlived == '\x01') {
          mirror_lifetime = (ushort)local_3048 + 0x7e120;
        }
        _lws_log(4,"opened mirror connection with %d lifetime\n",(ulong)(uint)mirror_lifetime);
        if (flag_no_mirror_traffic != '\0') {
          return 0;
        }
      }
      lws_callback_on_writable(wsi);
      return 0;
    }
    if (reason != LWS_CALLBACK_CLIENT_RECEIVE) {
      return 0;
    }
    if (flag_echo != '\x01') {
      return 0;
    }
    iVar3 = (int)len;
    if (0 < iVar3) {
      uVar6 = 0;
      do {
        uVar2 = rx_0 >> 1 ^ 0xb4bcd35c;
        if ((rx_0 & 1) == 0) {
          uVar2 = rx_0 >> 1;
        }
        rx_0 = uVar2 >> 1 ^ 0xb4bcd35c;
        if ((uVar2 & 1) == 0) {
          rx_0 = uVar2 >> 1;
        }
        uVar8 = rx_1 >> 1;
        uVar2 = rx_1 & 1;
        rx_1 = uVar8 ^ 0x7a5bc2e3;
        if (uVar2 == 0) {
          rx_1 = uVar8;
        }
        if (*(byte *)((long)in + uVar6) != (byte)((byte)rx_0 ^ (byte)rx_1)) {
          _lws_log(1,"mismatch at rxb %d offset %d\n",
                   (ulong)((int)((uVar6 & 0xffffffff) / 0x3000) + rxb),
                   (ulong)(uint)((int)uVar6 + (int)((uVar6 & 0xffffffff) / 0x3000) * -0x3000));
          errs = errs + 1;
          goto LAB_0010d28b;
        }
        uVar6 = uVar6 + 1;
      } while (iVar3 != (int)uVar6);
    }
    uVar1 = rx_count + iVar3;
    if (0x2fff < uVar1) {
      uVar2 = (rx_count + iVar3) - 0x3000;
      rxb = rxb + uVar2 / 0x3000 + 1;
      uVar1 = uVar2 % 0x3000;
    }
    if (uVar1 != 0) {
      rx_count = uVar1;
      return 0;
    }
    if (rxb != 0x400) {
      rx_count = uVar1;
      return 0;
    }
    rx_count = uVar1;
    _lws_log(4,"Everything received: errs %d\n",(ulong)errs);
LAB_0010d28b:
    force_exit = 1;
  }
  else {
    if (reason != LWS_CALLBACK_CLIENT_WRITEABLE) {
      if (reason != LWS_CALLBACK_CLIENT_CLOSED) {
        return 0;
      }
      _lws_log(4,"mirror: LWS_CALLBACK_CLOSED mirror_lifetime=%d, rxb %d, rx_count %d\n",
               (ulong)(uint)mirror_lifetime,(ulong)rxb,(ulong)rx_count);
      if ((flag_echo == '\0') && ((once & 1) == 0)) {
        wsi_mirror = (lws *)0x0;
        return 0;
      }
      force_exit = 1;
      wsi_mirror = (lws *)0x0;
      return 0;
    }
    _lws_log(0x400,"LWS_CALLBACK_CLIENT_WRITEABLE\n");
    if (flag_no_mirror_traffic != '\0') {
      return 0;
    }
    if (flag_echo == '\0') {
      plVar5 = lws_get_context(wsi);
      lws_get_random(plVar5,&local_3048,0x10);
      iVar3 = sprintf((char *)local_3028,"c #%06X %u %u %u;",(ulong)(local_3048 & 0xffffff),
                      (ulong)(local_3044 & 0x1ff),(ulong)local_3040,(ulong)((local_303c & 0x1f) + 1)
                     );
      iVar4 = lws_write(wsi,local_3028,(long)iVar3,LWS_WRITE_TEXT);
      if (iVar4 < 0) {
        return -1;
      }
      if (iVar4 < iVar3) {
        format = "Partial write LWS_CALLBACK_CLIENT_WRITEABLE\n";
        iVar3 = 1;
      }
      else {
        if (justmirror == '\0') {
          mirror_lifetime = mirror_lifetime + -1;
        }
        if (mirror_lifetime != 0) {
          lws_callback_on_writable(wsi);
          usleep(0x32);
          return 0;
        }
        format = "closing mirror session\n";
        iVar3 = 4;
      }
      _lws_log(iVar3,format);
      return -1;
    }
    lVar7 = 0x10;
    do {
      uVar2 = tx_0 >> 1 ^ 0xb4bcd35c;
      if ((tx_0 & 1) == 0) {
        uVar2 = tx_0 >> 1;
      }
      tx_0 = uVar2 >> 1 ^ 0xb4bcd35c;
      if ((uVar2 & 1) == 0) {
        tx_0 = uVar2 >> 1;
      }
      uVar8 = tx_1 >> 1;
      uVar2 = tx_1 & 1;
      tx_1 = uVar8 ^ 0x7a5bc2e3;
      if (uVar2 == 0) {
        tx_1 = uVar8;
      }
      abStack_3038[lVar7] = (byte)tx_0 ^ (byte)tx_1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x3010);
    iVar3 = lws_write(wsi,local_3028,0x3000,LWS_WRITE_TEXT);
    if (-1 < iVar3) {
      txb = txb + 1;
      if (txb != 0x400) {
        lws_callback_on_writable(wsi);
        return 0;
      }
      _lws_log(4,"send completed: %d x %d\n",0x400,0x3000);
      return 0;
    }
    _lws_log(1,"Error sending\n");
  }
  return -1;
}

Assistant:

static int
callback_lws_mirror(struct lws *wsi, enum lws_callback_reasons reason,
		    void *user, void *in, size_t len)
{
	unsigned char buf[LWS_PRE + block_size], *p;
	unsigned int rands[4];
	int l = 0;
	int n;

	switch (reason) {
	case LWS_CALLBACK_CLIENT_ESTABLISHED:

		lwsl_notice("mirror: LWS_CALLBACK_CLIENT_ESTABLISHED\n");

		if (flag_echo) {
			rxb = txb = 0;
			rx.cyc[0] = tx.cyc[0] = 0xabcde;
			rx.cyc[1] = tx.cyc[1] = 0x23456789;

			lws_callback_on_writable(wsi);

			break;
		}

		lws_get_random(lws_get_context(wsi), rands, sizeof(rands[0]));
		mirror_lifetime = 16384 + (rands[0] & 65535);
		/* useful to test single connection stability */
		if (longlived)
			mirror_lifetime += 500000;

		lwsl_notice("opened mirror connection with "
			  "%d lifetime\n", mirror_lifetime);

		/*
		 * mirror_lifetime is decremented each send, when it reaches
		 * zero the connection is closed in the send callback.
		 * When the close callback comes, wsi_mirror is set to NULL
		 * so a new connection will be opened
		 *
		 * start the ball rolling,
		 * LWS_CALLBACK_CLIENT_WRITEABLE will come next service
		 */
		if (!flag_no_mirror_traffic)
			lws_callback_on_writable(wsi);
		break;

	case LWS_CALLBACK_CLIENT_CLOSED:
		lwsl_notice("mirror: LWS_CALLBACK_CLOSED mirror_lifetime=%d, "
			    "rxb %d, rx_count %d\n", mirror_lifetime, rxb,
			    rx_count);
		wsi_mirror = NULL;
		if (flag_echo || once)
			force_exit = 1;
		break;

	case LWS_CALLBACK_CLIENT_WRITEABLE:
		lwsl_user("LWS_CALLBACK_CLIENT_WRITEABLE\n");
		if (flag_no_mirror_traffic)
			return 0;

		if (flag_echo) {
			for (n = 0; n < (int)block_size; n++)
				buf[LWS_PRE + n] = lws_poly_rand(&tx);

			n = lws_write(wsi, &buf[LWS_PRE], block_size,
				      opts | LWS_WRITE_TEXT);
			if (n < 0) {
				lwsl_err("Error sending\n");
				return -1;
			}

			txb++;
			if (txb != count_blocks)
				lws_callback_on_writable(wsi);
			else {
				lwsl_notice("send completed: %d x %d\n",
					    count_blocks, block_size);
			}
			break;
		}

		for (n = 0; n < 1; n++) {
			lws_get_random(lws_get_context(wsi), rands,
				       sizeof(rands));
			l += sprintf((char *)&buf[LWS_PRE + l],
					"c #%06X %u %u %u;",
					rands[0] & 0xffffff,	/* colour */
					rands[1] & 511,		/* x */
					rands[2] & 255,		/* y */
					(rands[3] & 31) + 1);	/* radius */
		}

		n = lws_write(wsi, &buf[LWS_PRE], l,
			      opts | LWS_WRITE_TEXT);
		if (n < 0)
			return -1;
		if (n < l) {
			lwsl_err("Partial write LWS_CALLBACK_CLIENT_WRITEABLE\n");
			return -1;
		}
		if (!justmirror)
			mirror_lifetime--;
		if (!mirror_lifetime) {
			lwsl_notice("closing mirror session\n");
			return -1;
		}
		/* get notified as soon as we can write again */
		lws_callback_on_writable(wsi);

#if !defined(_WIN32) && !defined(WIN32)
		usleep(50);
#endif
		break;

	case LWS_CALLBACK_CLIENT_RECEIVE:
		if (flag_echo) {
			p = (unsigned char *)in;
			for (n = 0; n < (int)len; n++)
				if (*p++ != lws_poly_rand(&rx)) {
					lwsl_err("mismatch at rxb %d offset %d\n", rxb + (n / block_size), n % block_size);
					errs++;
					force_exit = 1;
					return -1;
				}
			rx_count += (unsigned int)(unsigned long long)len;
			while (rx_count >= block_size) {
				rx_count -= block_size;
				rxb++;
			}
			if (rx_count == 0 && rxb == count_blocks) {
				lwsl_notice("Everything received: errs %d\n",
					    errs);
				force_exit = 1;
				return -1;
			}
		}
		break;
	default:
		break;
	}

	return 0;
}